

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterOfWrongType_Test::testBody
          (TEST_MockComparatorCopierTest_customTypeOutputParameterOfWrongType_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  MockCheckedExpectedCall *pMVar3;
  UtestShell *test;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MyTypeForTesting actualObject;
  MyTypeForTesting expectedObject;
  MyTypeForTestingCopier copier;
  MockUnexpectedOutputParameterFailure expectedFailure;
  MockNamedValue parameter;
  MockFailureReporterInstaller local_139;
  SimpleString local_138;
  SimpleString local_128;
  SimpleString local_118;
  SimpleString local_108;
  MockExpectedCallsList local_f8;
  MyTypeForTesting local_e8;
  MyTypeForTesting local_d8;
  undefined **local_c8;
  TestFailure local_c0;
  MockNamedValue local_58;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_139);
  MyTypeForTesting::MyTypeForTesting(&local_d8,0x1e248);
  MyTypeForTesting::MyTypeForTesting(&local_e8,0x1277e);
  local_c8 = &PTR__MockNamedValueCopier_002bc998;
  SimpleString::SimpleString((SimpleString *)&local_c0,"");
  pMVar2 = mock((SimpleString *)&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&local_58,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_58,&local_c8);
  SimpleString::~SimpleString((SimpleString *)&local_58);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_f8);
  SimpleString::SimpleString((SimpleString *)&local_c0,"foo");
  pMVar3 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)&local_f8,(SimpleString *)&local_c0);
  SimpleString::SimpleString((SimpleString *)&local_58,"MyTypeForTesting");
  SimpleString::SimpleString(&local_138,"output");
  (*(pMVar3->super_MockExpectedCall)._vptr_MockExpectedCall[7])
            (pMVar3,&local_58,&local_138,&local_d8);
  SimpleString::~SimpleString(&local_138);
  SimpleString::~SimpleString((SimpleString *)&local_58);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  SimpleString::SimpleString((SimpleString *)&local_c0,"output");
  MockNamedValue::MockNamedValue(&local_58,(SimpleString *)&local_c0);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  SimpleString::SimpleString((SimpleString *)&local_c0,"OtherTypeForTesting");
  MockNamedValue::setConstObjectPointer(&local_58,(SimpleString *)&local_c0,&local_e8);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_138,"foo");
  MockUnexpectedOutputParameterFailure::MockUnexpectedOutputParameterFailure
            ((MockUnexpectedOutputParameterFailure *)&local_c0,test,&local_138,&local_58,&local_f8);
  SimpleString::~SimpleString(&local_138);
  SimpleString::SimpleString(&local_138,"");
  pMVar2 = mock(&local_138,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_108,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_108);
  SimpleString::SimpleString(&local_118,"MyTypeForTesting");
  SimpleString::SimpleString(&local_128,"output");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_118,&local_128,&local_d8);
  SimpleString::~SimpleString(&local_128);
  SimpleString::~SimpleString(&local_118);
  SimpleString::~SimpleString(&local_108);
  SimpleString::~SimpleString(&local_138);
  SimpleString::SimpleString(&local_138,"");
  pMVar2 = mock(&local_138,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_108,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_108);
  SimpleString::SimpleString(&local_118,"OtherTypeForTesting");
  SimpleString::SimpleString(&local_128,"output");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_118,&local_128,&local_e8);
  SimpleString::~SimpleString(&local_128);
  SimpleString::~SimpleString(&local_118);
  SimpleString::~SimpleString(&local_108);
  SimpleString::~SimpleString(&local_138);
  SimpleString::SimpleString(&local_138,"");
  pMVar2 = mock(&local_138,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_138);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x106);
  SimpleString::SimpleString(&local_138,"");
  pMVar2 = mock(&local_138,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&local_138);
  TestFailure::~TestFailure(&local_c0);
  MockNamedValue::~MockNamedValue(&local_58);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_f8);
  MyTypeForTesting::~MyTypeForTesting(&local_e8);
  MyTypeForTesting::~MyTypeForTesting(&local_d8);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_139);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterOfWrongType)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting expectedObject(123464);
    MyTypeForTesting actualObject(75646);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    MockNamedValue parameter("output");
    parameter.setConstObjectPointer("OtherTypeForTesting", &actualObject);
    MockUnexpectedOutputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    mock().actualCall("foo").withOutputParameterOfType("OtherTypeForTesting", "output", &actualObject);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    mock().removeAllComparatorsAndCopiers();
}